

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O1

bool __thiscall CppGenerator::resortRelation(CppGenerator *this,size_t *rel_id,size_t *view_id)

{
  ulong *puVar1;
  ulong uVar2;
  TDNode *pTVar3;
  ulong *puVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  
  pTVar3 = TreeDecomposition::getRelation
                     ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,*rel_id);
  puVar4 = this->variableOrder[*view_id].
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = this->variableOrder[*view_id].
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar6 = puVar4 != puVar1;
  if (bVar6) {
    lVar5 = 0;
    do {
      uVar2 = *puVar4;
      if (((pTVar3->_bag).super__Base_bitset<2UL>._M_w[uVar2 >> 6] >> (uVar2 & 0x3f) & 1) == 0) {
        bVar7 = true;
      }
      else {
        bVar7 = this->sortOrders[*rel_id][lVar5] == uVar2;
        lVar5 = lVar5 + (ulong)bVar7;
      }
      if (!bVar7) {
        return bVar6;
      }
      puVar4 = puVar4 + 1;
      bVar6 = puVar4 != puVar1;
    } while (bVar6);
  }
  return bVar6;
}

Assistant:

bool CppGenerator::resortRelation(const size_t& rel_id, const size_t& view_id)
{
    TDNode* rel = _td->getRelation(rel_id);
    
    size_t orderIdx = 0;
    for (const size_t& var : variableOrder[view_id])
    {
        if (rel->_bag[var])
        {
            if (sortOrders[rel_id][orderIdx] != var)
                return true;
            ++orderIdx;
        }
    }
    
    return false;
}